

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageSetter.h
# Opt level: O2

void __thiscall
jaegertracing::baggage::BaggageSetter::
setBaggage<void(*)(__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>)>
          (BaggageSetter *this,Span *span,StrMap *baggage,string *key,string *value,
          _func_void___normal_iterator<const_jaegertracing::Tag_ptr,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>___normal_iterator<const_jaegertracing::Tag_ptr,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
          *logFn)

{
  int iVar1;
  RestrictionManager *pRVar2;
  Counter *pCVar3;
  uint uVar4;
  int extraout_var;
  iterator iVar5;
  mapped_type *pmVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> prevItem;
  
  pRVar2 = this->_restrictionManager;
  jaegertracing::Span::serviceNameNoLock_abi_cxx11_();
  uVar4 = (*pRVar2->_vptr_RestrictionManager[2])(pRVar2,&prevItem,key);
  std::__cxx11::string::~string((string *)&prevItem);
  if ((uVar4 & 1) == 0) {
    prevItem._M_dataplus._M_p = (pointer)&prevItem.field_2;
    prevItem._M_string_length = 0;
    prevItem.field_2._M_local_buf[0] = '\0';
    logFields<void(*)(__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>)>
              (this,span,key,value,&prevItem,false,false,logFn);
    std::__cxx11::string::~string((string *)&prevItem);
    pCVar3 = (this->_metrics->_baggageUpdateFailure)._M_t.
             super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
             .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl;
    (*pCVar3->_vptr_Counter[2])(pCVar3,1);
  }
  else {
    iVar1 = (int)value->_M_string_length;
    if (extraout_var < iVar1) {
      std::__cxx11::string::substr((ulong)&prevItem,(ulong)value);
      std::__cxx11::string::operator=((string *)value,(string *)&prevItem);
      std::__cxx11::string::~string((string *)&prevItem);
      pCVar3 = (this->_metrics->_baggageTruncate)._M_t.
               super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
               ._M_t.
               super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
               .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl;
      (*pCVar3->_vptr_Counter[2])(pCVar3,1);
    }
    iVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&baggage->_M_h,key);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      prevItem._M_dataplus._M_p = (pointer)&prevItem.field_2;
      prevItem._M_string_length = 0;
      prevItem.field_2._M_local_buf[0] = '\0';
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)baggage,key);
    }
    else {
      pmVar6 = (mapped_type *)
               ((long)iVar5.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      ._M_cur + 0x28);
      std::__cxx11::string::string((string *)&prevItem,(string *)pmVar6);
    }
    std::__cxx11::string::_M_assign((string *)pmVar6);
    logFields<void(*)(__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>)>
              (this,span,key,value,&prevItem,extraout_var < iVar1,true,logFn);
    pCVar3 = (this->_metrics->_baggageUpdateSuccess)._M_t.
             super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
             .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl;
    (*pCVar3->_vptr_Counter[2])(pCVar3,1);
    std::__cxx11::string::~string((string *)&prevItem);
  }
  return;
}

Assistant:

void setBaggage(Span& span,
                    SpanContext::StrMap& baggage,
                    const std::string& key,
                    std::string value,
                    LoggingFunction logFn) const
    {
        auto truncated = false;
        const auto restriction =
            _restrictionManager.getRestriction(span.serviceNameNoLock(), key);
        if (!restriction.keyAllowed()) {
            logFields(span,
                      key,
                      value,
                      std::string(),
                      truncated,
                      restriction.keyAllowed(),
                      logFn);
            _metrics.baggageUpdateFailure().inc(1);
            return;
        }

        if (static_cast<int>(value.size()) > restriction.maxValueLength()) {
            truncated = true;
            value = value.substr(0, restriction.maxValueLength());
            _metrics.baggageTruncate().inc(1);
        }

        auto itr = baggage.find(key);
        const auto prevItem =
            (itr == std::end(baggage) ? std::string() : itr->second);
        if (itr == std::end(baggage)) {
            baggage[key] = value;
        }
        else {
            itr->second = value;
        }
        logFields(span,
                  key,
                  value,
                  prevItem,
                  truncated,
                  restriction.keyAllowed(),
                  logFn);
        _metrics.baggageUpdateSuccess().inc(1);
    }